

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  pixel_type ra_00;
  int32_t iVar1;
  uint uVar2;
  quad<unsigned_char> qVar3;
  pixel_type rb;
  uint32_t end_index;
  int32_t run_length;
  pixel_type ra;
  decoder_strategy *param_2_local;
  int32_t start_index_local;
  jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
  *this_local;
  
  ra_00 = this->current_line_[start_index + -1];
  iVar1 = decode_run_pixels(this,ra_00,this->current_line_ + start_index,this->width_ - start_index)
  ;
  uVar2 = start_index + iVar1;
  if (uVar2 == this->width_) {
    this_local._4_4_ = uVar2 - start_index;
  }
  else {
    qVar3 = decode_run_interruption_pixel(this,ra_00,this->previous_line_[uVar2]);
    this->current_line_[uVar2] = qVar3;
    decrement_run_index(this);
    this_local._4_4_ = (uVar2 - start_index) + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }